

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

size_t readstr<std::shared_ptr<ReadWriter>>(shared_ptr<ReadWriter> *rd,string *v,size_t n)

{
  element_type *peVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = 0;
  std::__cxx11::string::resize((ulong)v,(char)n);
  peVar1 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar4 = (*peVar1->_vptr_ReadWriter[2])(peVar1,(v->_M_dataplus)._M_p,n);
  std::__cxx11::string::resize((ulong)v,(char)iVar4);
  pcVar2 = (v->_M_dataplus)._M_p;
  if (*pcVar2 != '\0') {
    lVar5 = 0;
    do {
      lVar6 = lVar5 + 1;
      lVar3 = lVar5 + 1;
      lVar5 = lVar6;
    } while (pcVar2[lVar3] != '\0');
  }
  std::__cxx11::string::resize((ulong)v,(char)lVar6);
  return v->_M_string_length;
}

Assistant:

size_t readstr(PTR rd, std::string& v, size_t n)
{
    v.resize(n);
    size_t nr= rd->read((uint8_t*)&v[0], n);
    v.resize(nr);
    v.resize(stringlength(&v[0]));
    return v.size();
}